

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevoluteSpherical.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkRevoluteSpherical::ArchiveIN(ChLinkRevoluteSpherical *this,ChArchiveIn *marchive)

{
  ChNameValue<double> local_78;
  ChNameValue<chrono::ChVector<double>_> local_60;
  ChNameValue<chrono::ChVector<double>_> local_48;
  ChNameValue<chrono::ChVector<double>_> local_30;
  
  ChArchiveIn::VersionRead<chrono::ChLinkRevoluteSpherical>(marchive);
  ChLink::ArchiveIN(&this->super_ChLink,marchive);
  local_30._value = &this->m_pos1;
  local_30._name = "m_pos1";
  local_30._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = &this->m_pos2;
  local_48._name = "m_pos2";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  local_60._value = &this->m_dir1;
  local_60._name = "m_dir1";
  local_60._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_60);
  local_78._value = &this->m_dist;
  local_78._name = "m_dist";
  local_78._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_78);
  return;
}

Assistant:

void ChLinkRevoluteSpherical::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChLinkRevoluteSpherical>();

    // deserialize parent class
    ChLink::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(m_pos1);
    marchive >> CHNVP(m_pos2);
    marchive >> CHNVP(m_dir1);
    marchive >> CHNVP(m_dist);
}